

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::FunctionBreakpoint>::copyConstruct
          (BasicTypeInfo<dap::FunctionBreakpoint> *this,void *dst,void *src)

{
  FunctionBreakpoint::FunctionBreakpoint((FunctionBreakpoint *)dst,(FunctionBreakpoint *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }